

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.hpp
# Opt level: O2

void __thiscall arm::LabelInst::~LabelInst(LabelInst *this)

{
  std::__cxx11::string::~string((string *)&this->label);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~LabelInst() {}